

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O1

void __thiscall chrono::ChLinkRackpinion::ArchiveIN(ChLinkRackpinion *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChFrame<double>_> specFuncA;
  char *local_58;
  double *local_50;
  undefined1 local_48;
  undefined **local_40;
  ChFrame<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkRackpinion>(marchive);
  ChLinkMateGeneric::ArchiveIN(&this->super_ChLinkMateGeneric,marchive);
  local_50 = &this->R;
  local_58 = "R";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = &this->alpha;
  local_58 = "alpha";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = &this->beta;
  local_58 = "beta";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = &this->phase;
  local_58 = "phase";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = (double *)&this->checkphase;
  local_58 = "checkphase";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_58);
  local_50 = &this->a1;
  local_58 = "a1";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_38 = &this->local_pinion;
  local_40 = &PTR__ChFunctorArchiveIn_00b39088;
  local_58 = "local_pinion";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->local_rack;
  local_40 = &PTR__ChFunctorArchiveIn_00b39088;
  local_58 = "local_rack";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChLinkRackpinion::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkRackpinion>();

    // deserialize parent class
    ChLinkMateGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(R);
    marchive >> CHNVP(alpha);
    marchive >> CHNVP(beta);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(checkphase);
    marchive >> CHNVP(a1);
    marchive >> CHNVP(local_pinion);
    marchive >> CHNVP(local_rack);
}